

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingOpenCV.h
# Opt level: O2

void DrawBarcode(Mat *img,Barcode *barcode)

{
  PointT<int> PVar1;
  PointT<int> PVar2;
  PointT<int> PVar3;
  initializer_list<cv::Point_<int>_> __l;
  _InputOutputArray local_c0;
  Point_<int> *pts;
  int npts;
  Matx<double,_4,_1> local_98;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> contour;
  int local_60;
  int local_5c;
  Matx<double,_4,_1> local_58;
  
  PVar1 = (barcode->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0];
  PVar2 = (barcode->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1];
  local_98.val[2] =
       *(double *)((barcode->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems + 2);
  PVar3 = (barcode->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3];
  local_98.val[0]._0_4_ = PVar1.x;
  local_98.val[0]._4_4_ = PVar1.y;
  local_98.val[1]._0_4_ = PVar2.x;
  local_98.val[1]._4_4_ = PVar2.y;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_98;
  local_98.val[3] = (double)PVar3;
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            (&contour,__l,(allocator_type *)&local_c0);
  pts = contour.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_c0.super__OutputArray.super__InputArray.sz.width = 0;
  local_c0.super__OutputArray.super__InputArray.sz.height = 0;
  npts = (int)((ulong)((long)contour.
                             super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)contour.
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_c0.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_c0.super__OutputArray.super__InputArray.obj = img;
  cv::Matx<double,_4,_1>::Matx(&local_98);
  local_98.val[0]._0_4_ = 0;
  local_98.val[0]._4_4_ = 0;
  local_98.val[1]._0_4_ = 0;
  local_98.val[1]._4_4_ = 0x406fe000;
  local_98.val[2] = 0.0;
  local_98.val[3] = 0.0;
  cv::polylines(&local_c0,(Point_ **)&pts,&npts,1,true,(Scalar_ *)&local_98,1,8,0);
  local_c0.super__OutputArray.super__InputArray.sz.width = 0;
  local_c0.super__OutputArray.super__InputArray.sz.height = 0;
  local_c0.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_c0.super__OutputArray.super__InputArray.obj = img;
  ZXing::Result::text_abi_cxx11_();
  local_5c = PVar3.y + 0x14;
  local_60 = PVar3.x;
  cv::Matx<double,_4,_1>::Matx(&local_58);
  local_58.val[0]._0_4_ = 0;
  local_58.val[0]._4_4_ = 0;
  local_58.val[1]._0_4_ = 0;
  local_58.val[1]._4_4_ = 0x406fe000;
  local_58.val[2] = 0.0;
  local_58.val[3] = 0.0;
  cv::putText(0,&local_c0,&local_98,&local_60,2,&local_58,1,8,0);
  std::__cxx11::string::~string((string *)&local_98);
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
            (&contour.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
  return;
}

Assistant:

inline void DrawBarcode(cv::Mat& img, ZXing::Barcode barcode)
{
	auto pos = barcode.position();
	auto zx2cv = [](ZXing::PointI p) { return cv::Point(p.x, p.y); };
	auto contour = std::vector<cv::Point>{zx2cv(pos[0]), zx2cv(pos[1]), zx2cv(pos[2]), zx2cv(pos[3])};
	const auto* pts = contour.data();
	int npts = contour.size();

	cv::polylines(img, &pts, &npts, 1, true, CV_RGB(0, 255, 0));
	cv::putText(img, barcode.text(), zx2cv(pos[3]) + cv::Point(0, 20), cv::FONT_HERSHEY_DUPLEX, 0.5, CV_RGB(0, 255, 0));
}